

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::PlainSkipTemplated<duckdb::DecimalParquetValueConversion<long,false>>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  uint64_t uVar1;
  
  if ((defines == (uint8_t *)0x0) || (this->column_schema->max_define == 0)) {
    if (num_values != 0) {
      do {
        DecimalParquetValueConversion<long,_false>::PlainSkip<false>(plain_data,this);
        num_values = num_values - 1;
      } while (num_values != 0);
    }
  }
  else if (num_values != 0) {
    uVar1 = 0;
    do {
      if (this->column_schema->max_define == (ulong)defines[uVar1]) {
        DecimalParquetValueConversion<long,_false>::PlainSkip<false>(plain_data,this);
      }
      uVar1 = uVar1 + 1;
    } while (num_values != uVar1);
  }
  return;
}

Assistant:

void PlainSkipTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values) {
		if (HasDefines() && defines) {
			PlainSkipTemplatedDefines<CONVERSION, true>(plain_data, defines, num_values);
		} else {
			PlainSkipTemplatedDefines<CONVERSION, false>(plain_data, defines, num_values);
		}
	}